

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitTraitStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,TraitStmt *stmt)

{
  bool bVar1;
  ostream *poVar2;
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  *this_00;
  type stmt_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *local_1d8;
  unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *method;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  *__range1;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [376];
  TraitStmt *local_20;
  TraitStmt *stmt_local;
  AstSerialise *this_local;
  
  local_20 = stmt;
  stmt_local = (TraitStmt *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(local_198,(string *)&this->m_ident);
  poVar2 = std::operator<<(poVar2,"(Stmt::Trait ");
  poVar2 = std::operator<<(poVar2,(string *)&(local_20->name).lexeme);
  std::operator<<(poVar2," (\n");
  std::__cxx11::string::operator+=((string *)&this->m_ident,"    ");
  this_00 = &local_20->methods;
  __end1 = std::
           vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
           ::begin(this_00);
  method = (unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_> *)
           std::
           vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
           ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_*,_std::vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>_>
                                *)&method);
    if (!bVar1) break;
    local_1d8 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_*,_std::vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>_>
                ::operator*(&__end1);
    poVar2 = std::operator<<(local_198,(string *)&this->m_ident);
    stmt_00 = std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>::
              operator*(local_1d8);
    StmtVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    visitStmt(&local_1f8,
              (StmtVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this,&stmt_00->super_Stmt);
    poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_1f8);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_*,_std::vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  std::operator<<(local_198,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitTraitStmt(TraitStmt &stmt) {
        std::stringstream s;

        s << m_ident << "(Stmt::Trait " << stmt.name.lexeme << " (\n";
        m_ident += "    ";

        for (auto &method : stmt.methods) {
            s << m_ident << visitStmt(*method) << "\n";
        }

        m_ident.erase(0, 4);
        s << ")";

        return s.str();
    }